

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.cc
# Opt level: O0

bool anon_unknown.dwarf_197ce::consume_bytes<unsigned_char>
               (uint8_t *stream,size_t len,uint8_t **pointer,uchar *destination)

{
  uint8_t *puVar1;
  uint8_t uVar2;
  bool bVar3;
  uchar *destination_local;
  uint8_t **pointer_local;
  size_t len_local;
  uint8_t *stream_local;
  
  bVar3 = true;
  if ((len != 0) && (bVar3 = false, stream <= *pointer)) {
    bVar3 = *pointer < stream + len;
  }
  if (bVar3) {
    puVar1 = *pointer;
    if (puVar1 + 1 <= stream + len) {
      uVar2 = ntoh(**pointer);
      *destination = uVar2;
      *pointer = *pointer + 1;
    }
    return puVar1 + 1 <= stream + len;
  }
  __assert_fail("len == 0 || (pointer >= stream && pointer < stream + len)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Xanewok[P]netacka-clone/protocol.cc"
                ,0x2e,
                "bool (anonymous namespace)::consume_bytes(const std::uint8_t *, size_t, const std::uint8_t *&, T &) [T = unsigned char]"
               );
}

Assistant:

bool consume_bytes(const std::uint8_t* stream, size_t len, const std::uint8_t*& pointer, T& destination)
	{
		assert(len == 0 || (pointer >= stream && pointer < stream + len));
		// Not enough data in the stream
		if (pointer + sizeof(T) > stream + len)
			return false;

		destination = ntoh(*reinterpret_cast<const T*>(pointer));
		pointer += sizeof(T);
		return true;
	}